

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeGetStackPos(AsyncifyBuilder *this)

{
  Name name;
  uint bytes;
  uint align;
  GlobalGet *ptr;
  Load *pLVar1;
  Address local_18;
  AsyncifyBuilder *local_10;
  AsyncifyBuilder *this_local;
  
  local_10 = this;
  bytes = wasm::Type::getByteSize(&this->pointerType);
  wasm::Address::Address(&local_18,0);
  align = wasm::Type::getByteSize(&this->pointerType);
  name.super_IString.str._M_str = DAT_027e50a0;
  name.super_IString.str._M_len = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  ptr = Builder::makeGlobalGet(&this->super_Builder,name,(Type)(this->pointerType).id);
  pLVar1 = Builder::makeLoad(&this->super_Builder,bytes,false,local_18,align,(Expression *)ptr,
                             (Type)(this->pointerType).id,
                             (Name)(this->asyncifyMemory).super_IString.str);
  return (Expression *)pLVar1;
}

Assistant:

Expression* makeGetStackPos() {
    return makeLoad(pointerType.getByteSize(),
                    false,
                    int(DataOffset::BStackPos),
                    pointerType.getByteSize(),
                    makeGlobalGet(ASYNCIFY_DATA, pointerType),
                    pointerType,
                    asyncifyMemory);
  }